

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::Initialize
          (CSharedMemoryObject *this,CPalThread *pthr,CObjectAttributes *poa)

{
  PAL_ERROR PVar1;
  LPVOID pvVar2;
  void *pvVar3;
  char *__format;
  SHMObjData *local_30;
  SHMObjData *psmod;
  
  local_30 = (SHMObjData *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x35);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x36);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033cb39;
  PVar1 = CPalObjectBase::Initialize(&this->super_CPalObjectBase,pthr,poa);
  if (PVar1 == 0) {
    if ((this->super_CPalObjectBase).m_oa.sObjectName.m_dwStringLength != 0) {
      this->m_ObjectDomain = SharedObject;
      PVar1 = AllocateSharedDataItems(this,&this->m_shmod,&local_30);
      if ((PVar1 != 0) || (local_30 == (SHMObjData *)0x0)) goto LAB_0033c9df;
    }
    if (((this->super_CPalObjectBase).m_pot)->m_dwSharedDataSize != 0) {
      if (this->m_ObjectDomain == SharedObject) {
        if (local_30 == (SHMObjData *)0x0) {
          fprintf(_stderr,"] %s %s:%d","Initialize",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0x5e);
          __format = "psmod should not be NULL";
        }
        else {
          pvVar2 = SHMPtrToPtr(local_30->shmObjSharedData);
          this->m_pvSharedData = pvVar2;
          if (pvVar2 != (LPVOID)0x0) goto LAB_0033cac6;
          fprintf(_stderr,"] %s %s:%d","Initialize",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0x66);
          __format = "Unable to map shared data area\n";
        }
        fprintf(_stderr,__format);
        PVar1 = 0x54f;
      }
      else {
        InternalInitializeCriticalSection(&(this->m_sdlSharedData).m_cs);
        (this->m_sdlSharedData).m_fInitialized = true;
        pvVar3 = InternalMalloc((ulong)((this->super_CPalObjectBase).m_pot)->m_dwSharedDataSize);
        this->m_pvSharedData = pvVar3;
        PVar1 = 0;
        if (pvVar3 == (void *)0x0) {
          PVar1 = 0xe;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033cb39;
        }
        else {
LAB_0033cac6:
          memset(this->m_pvSharedData,0,
                 (ulong)((this->super_CPalObjectBase).m_pot)->m_dwSharedDataSize);
        }
      }
    }
  }
LAB_0033c9df:
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar1;
  }
LAB_0033cb39:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::Initialize(
    CPalThread *pthr,
    CObjectAttributes *poa
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMObjData *psmod = NULL;

    _ASSERTE(NULL != pthr); 
    _ASSERTE(NULL != poa);

    ENTRY("CSharedMemoryObject::Initialize"
        "(this = %p, pthr = %p, poa = %p)\n",
        this,
        pthr,
        poa
        );

    palError = CPalObjectBase::Initialize(pthr, poa);
    if (NO_ERROR != palError)
    {
        goto InitializeExit;
    }

    //
    // If this is a named object it needs to go into the shared domain;
    // otherwise it remains local
    //

    if (0 != m_oa.sObjectName.GetStringLength())
    {   
        m_ObjectDomain = SharedObject;

        palError = AllocateSharedDataItems(&m_shmod, &psmod);
        if (NO_ERROR != palError || NULL == psmod)
        {
            goto InitializeExit;
        }
    }

    if (0 != m_pot->GetSharedDataSize())
    {       
        if (SharedObject == m_ObjectDomain)
        {
            //
            // Map the shared data into our address space
            //
            if (NULL == psmod)
            {
                ASSERT("psmod should not be NULL");
                palError = ERROR_INTERNAL_ERROR;
                goto InitializeExit;
            } 

            m_pvSharedData = SHMPTR_TO_TYPED_PTR(VOID, psmod->shmObjSharedData);
            if (NULL == m_pvSharedData)
            {
                ASSERT("Unable to map shared data area\n");
                palError = ERROR_INTERNAL_ERROR;
                goto InitializeExit;
            }
        }
        else 
        {
            //
            // Initialize the local shared data lock.
            //

            palError = m_sdlSharedData.Initialize();
            if (NO_ERROR != palError)
            {
                ERROR("Failure initializing m_sdlSharedData\n");
                goto InitializeExit;
            } 
        
            //
            // Allocate local memory to hold the shared data
            //

            m_pvSharedData = InternalMalloc(m_pot->GetSharedDataSize());
            if (NULL == m_pvSharedData)
            {
                ERROR("Failure allocating m_pvSharedData (local copy)\n");
                palError = ERROR_OUTOFMEMORY;
                goto InitializeExit;
            }
        }

        ZeroMemory(m_pvSharedData, m_pot->GetSharedDataSize());
    }


InitializeExit:

    LOGEXIT("CSharedMemoryObject::Initialize returns %d\n", palError);

    return palError;
}